

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

bool cmState::ParseCacheEntry(string *entry,string *var,string *value,CacheEntryType *type)

{
  CacheEntryType *pCVar1;
  bool bVar2;
  int iVar3;
  CacheEntryType CVar4;
  ulong uVar5;
  char *pcVar6;
  string local_120 [32];
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  byte local_3d;
  bool flag;
  CacheEntryType *local_30;
  CacheEntryType *type_local;
  string *value_local;
  string *var_local;
  string *entry_local;
  
  local_30 = type;
  type_local = (CacheEntryType *)value;
  value_local = var;
  var_local = entry;
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::reg == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::reg), iVar3 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseCacheEntry::reg,"^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::reg,&__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::reg);
  }
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::regQuoted == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::regQuoted), iVar3 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseCacheEntry::regQuoted,"^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::regQuoted,
                 &__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::regQuoted);
  }
  local_3d = 0;
  bVar2 = cmsys::RegularExpression::find(&ParseCacheEntry::regQuoted,var_local);
  if (bVar2) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_60,&ParseCacheEntry::regQuoted,1);
    std::__cxx11::string::operator=((string *)value_local,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    cmsys::RegularExpression::match_abi_cxx11_(&local_80,&ParseCacheEntry::regQuoted,2);
    CVar4 = StringToCacheEntryType(&local_80);
    *local_30 = CVar4;
    std::__cxx11::string::~string((string *)&local_80);
    cmsys::RegularExpression::match_abi_cxx11_(&local_a0,&ParseCacheEntry::regQuoted,3);
    std::__cxx11::string::operator=((string *)type_local,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    local_3d = 1;
  }
  else {
    bVar2 = cmsys::RegularExpression::find(&ParseCacheEntry::reg,var_local);
    if (bVar2) {
      cmsys::RegularExpression::match_abi_cxx11_(&local_c0,&ParseCacheEntry::reg,1);
      std::__cxx11::string::operator=((string *)value_local,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      cmsys::RegularExpression::match_abi_cxx11_(&local_e0,&ParseCacheEntry::reg,2);
      CVar4 = StringToCacheEntryType(&local_e0);
      *local_30 = CVar4;
      std::__cxx11::string::~string((string *)&local_e0);
      cmsys::RegularExpression::match_abi_cxx11_(&local_100,&ParseCacheEntry::reg,3);
      std::__cxx11::string::operator=((string *)type_local,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      local_3d = 1;
    }
  }
  if (((((local_3d & 1) != 0) && (uVar5 = std::__cxx11::string::size(), 1 < uVar5)) &&
      (pcVar6 = (char *)std::__cxx11::string::front(), *pcVar6 == '\'')) &&
     (pcVar6 = (char *)std::__cxx11::string::back(), pCVar1 = type_local, *pcVar6 == '\'')) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_120,(ulong)pCVar1);
    std::__cxx11::string::operator=((string *)type_local,local_120);
    std::__cxx11::string::~string(local_120);
  }
  if ((local_3d & 1) == 0) {
    entry_local._7_1_ = ParseEntryWithoutType(var_local,value_local,(string *)type_local);
  }
  else {
    entry_local._7_1_ = (bool)(local_3d & 1);
  }
  return entry_local._7_1_;
}

Assistant:

bool cmState::ParseCacheEntry(const std::string& entry, std::string& var,
                              std::string& value,
                              cmStateEnums::CacheEntryType& type)
{
  // input line is:         key:type=value
  static cmsys::RegularExpression reg(
    "^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  // input line is:         "key":type=value
  static cmsys::RegularExpression regQuoted(
    "^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  bool flag = false;
  if (regQuoted.find(entry)) {
    var = regQuoted.match(1);
    type = cmState::StringToCacheEntryType(regQuoted.match(2));
    value = regQuoted.match(3);
    flag = true;
  } else if (reg.find(entry)) {
    var = reg.match(1);
    type = cmState::StringToCacheEntryType(reg.match(2));
    value = reg.match(3);
    flag = true;
  }

  // if value is enclosed in single quotes ('foo') then remove them
  // it is used to enclose trailing space or tab
  if (flag && value.size() >= 2 && value.front() == '\'' &&
      value.back() == '\'') {
    value = value.substr(1, value.size() - 2);
  }

  if (!flag) {
    return ParseEntryWithoutType(entry, var, value);
  }

  return flag;
}